

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconnect.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  milliseconds cycleTime;
  thread streamer;
  StreamClient stream;
  duration<long,_std::ratio<1L,_1000L>_> dStack_40218;
  StreamClient *pSStack_40210;
  thread tStack_40208;
  code *pcStack_40200;
  undefined8 uStack_401f8;
  code *apcStack_401f0 [2];
  code *pcStack_401e0;
  code *pcStack_401d8;
  _Bind<int_(hbm::streaming::StreamClient::*(hbm::streaming::StreamClient_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  _Stack_401d0;
  StreamClient SStack_40170;
  
  dStack_40218.__r = 3000;
  if (1 < argc) {
    std::__cxx11::string::string((string *)&SStack_40170,argv[1],(allocator *)&_Stack_401d0);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &SStack_40170,"-h");
    std::__cxx11::string::~string((string *)&SStack_40170);
    if (!bVar1) {
      if (main::address_abi_cxx11_ == '\0') {
        iVar2 = __cxa_guard_acquire(&main::address_abi_cxx11_);
        if (iVar2 != 0) {
          std::__cxx11::string::string
                    ((string *)&main::address_abi_cxx11_,argv[1],(allocator *)&SStack_40170);
          __cxa_atexit(std::__cxx11::string::~string,&main::address_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&main::address_abi_cxx11_);
        }
      }
      if (argc != 2) {
        iVar2 = atoi(argv[2]);
        dStack_40218.__r = (rep)iVar2;
      }
      hbm::streaming::StreamClient::StreamClient(&SStack_40170);
      apcStack_401f0[1] = (code *)0x0;
      apcStack_401f0[0] = streamMetaInformationCb;
      pcStack_401d8 =
           std::
           _Function_handler<void_(hbm::streaming::StreamClient_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_&),_void_(*)(hbm::streaming::StreamClient_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_&)>
           ::_M_invoke;
      pcStack_401e0 =
           std::
           _Function_handler<void_(hbm::streaming::StreamClient_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_&),_void_(*)(hbm::streaming::StreamClient_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_&)>
           ::_M_manager;
      hbm::streaming::StreamClient::setStreamMetaCb(&SStack_40170,(StreamMetaCb_t *)apcStack_401f0);
      std::_Function_base::~_Function_base((_Function_base *)apcStack_401f0);
      do {
        pcStack_40200 = hbm::streaming::StreamClient::start;
        uStack_401f8 = 0;
        pSStack_40210 = &SStack_40170;
        std::
        _Bind<int(hbm::streaming::StreamClient::*(hbm::streaming::StreamClient*,std::__cxx11::string,std::__cxx11::string,char_const*))(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)>
        ::
        _Bind<hbm::streaming::StreamClient*,std::__cxx11::string_const&,std::__cxx11::string_const&,char_const(&)[1]>
                  ((_Bind<int(hbm::streaming::StreamClient::*(hbm::streaming::StreamClient*,std::__cxx11::string,std::__cxx11::string,char_const*))(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)>
                    *)&_Stack_401d0,(offset_in_StreamClient_to_subr *)&pcStack_40200,&pSStack_40210,
                   &main::address_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   hbm::streaming::DAQSTREAM_PORT_abi_cxx11_,(char (*) [1])0x12dbe2);
        std::thread::
        thread<std::_Bind<int(hbm::streaming::StreamClient::*(hbm::streaming::StreamClient*,std::__cxx11::string,std::__cxx11::string,char_const*))(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)>,,void>
                  (&tStack_40208,&_Stack_401d0);
        std::
        _Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
        ::~_Tuple_impl((_Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
                        *)&_Stack_401d0._M_bound_args);
        poVar3 = std::operator<<((ostream *)&std::cout,"Started");
        std::endl<char,std::char_traits<char>>(poVar3);
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&dStack_40218);
        hbm::streaming::StreamClient::stop(&SStack_40170);
        std::thread::join();
        std::thread::~thread(&tStack_40208);
      } while( true );
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "periodically connects to a daq stream, subscribes all signals and disconnects after a specified time"
                          );
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"syntax: ");
  poVar3 = std::operator<<(poVar3,*argv);
  poVar3 = std::operator<<(poVar3," <stream server address> <cycle time in ms (default is ");
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  poVar3 = std::operator<<(poVar3,")>");
  std::endl<char,std::char_traits<char>>(poVar3);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	std::chrono::milliseconds cycleTime(3000);

	if((argc<2) || (std::string(argv[1])=="-h") ) {
		std::cout << "periodically connects to a daq stream, subscribes all signals and disconnects after a specified time" << std::endl;
		std::cout << "syntax: " << argv[0] << " <stream server address> <cycle time in ms (default is " << cycleTime.count() << ")>" << std::endl;
		return EXIT_SUCCESS;
	}


	static const std::string address = argv[1];



	if(argc>2) {
		cycleTime = std::chrono::milliseconds(atoi(argv[2]));
	}

	hbm::streaming::StreamClient stream;
	stream.setStreamMetaCb(streamMetaInformationCb);
	do {
		std::thread streamer = std::thread(std::bind(&hbm::streaming::StreamClient::start, &stream, address, hbm::streaming::DAQSTREAM_PORT, ""));
		std::cout << "Started" << std::endl;
		std::this_thread::sleep_for(cycleTime);
		stream.stop();
		streamer.join();
	} while(true);
}